

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

Expression * __thiscall
soul::ResolutionPass::FunctionResolver::visit(FunctionResolver *this,CallOrCast *call)

{
  IdentifierPath *this_00;
  size_t *psVar1;
  Expression *pEVar2;
  Allocator *pAVar3;
  CommaSeparatedList *pCVar4;
  pointer pPVar5;
  size_t sVar6;
  pool_ref<soul::AST::Expression> *ppVar7;
  long *plVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  TypeCast *pTVar14;
  QualifiedIdentifier *name;
  size_t sVar15;
  pool_ref<soul::AST::Function> *ppVar16;
  pool_ref<soul::AST::Function> *extraout_RDX;
  pool_ref<soul::AST::Function> *extraout_RDX_00;
  PossibleFunction *f;
  CallOrCast *pCVar17;
  ulong uVar18;
  pool_ref<soul::AST::Expression> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  StaticAssertion *unaff_R13;
  long lVar19;
  StaticAssertion *pSVar20;
  byte bVar21;
  bool bVar22;
  ArrayView<soul::pool_ref<soul::AST::Function>_> functions_00;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> functions;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> matchingGenerics;
  pool_ptr<soul::AST::Expression> resolved;
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> possibles;
  long local_2e8;
  char *local_2d8;
  char *local_2c0;
  undefined1 local_2b8 [24];
  SanityCheckPass local_2a0 [32];
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> local_280;
  undefined1 local_248 [216];
  ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL> local_170;
  string local_118;
  string local_f8;
  string local_d8;
  Type local_b8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,call);
  pEVar2 = (call->nameOrType).object;
  if ((pEVar2->kind == type) &&
     (iVar13 = (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar13 != '\0')) {
    pAVar3 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    (*(((call->nameOrType).object)->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_b8);
    pTVar14 = convertToCast(pAVar3,call,&local_b8);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_b8.structure.object);
    return &pTVar14->super_Expression;
  }
  pCVar4 = (call->super_CallOrCastBase).arguments.object;
  if ((pCVar4 != (CommaSeparatedList *)0x0) &&
     (iVar13 = (*(pCVar4->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(),
     (char)iVar13 == '\0')) goto LAB_0021b325;
  pEVar2 = (call->nameOrType).object;
  if (pEVar2 == (Expression *)0x0) {
    name = (QualifiedIdentifier *)0x0;
  }
  else {
    name = (QualifiedIdentifier *)
           __dynamic_cast(pEVar2,&AST::Expression::typeinfo,&AST::QualifiedIdentifier::typeinfo,0);
  }
  if (name == (QualifiedIdentifier *)0x0) {
    bVar11 = true;
  }
  else {
    this_00 = &name->pathPrefix;
    IdentifierPath::operator+
              ((IdentifierPath *)local_248,this_00,
               &((name->pathSections).
                 super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                 ._M_impl.super__Vector_impl_data._M_start)->path);
    bVar11 = IdentifierPath::isUnqualifiedName((IdentifierPath *)local_248,"advance");
    local_248._8_8_ = 0;
    if ((ResolutionPass *)0x8 < (ulong)local_248._16_8_) {
      if ((StaticAssertion *)local_248._0_8_ != (StaticAssertion *)0x0) {
        operator_delete__((void *)local_248._0_8_);
      }
      local_248._0_8_ = local_248 + 0x18;
      local_248._16_8_ = (ResolutionPass *)0x8;
    }
    if (bVar11) {
      unaff_R13 = (StaticAssertion *)createAdvanceCall(this,call);
    }
    else {
      IdentifierPath::operator+
                ((IdentifierPath *)local_248,this_00,
                 &((name->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_start)->path);
      bVar11 = IdentifierPath::isUnqualifiedName((IdentifierPath *)local_248,"static_assert");
      local_248._8_8_ = 0;
      if ((ResolutionPass *)0x8 < (ulong)local_248._16_8_) {
        if ((StaticAssertion *)local_248._0_8_ != (StaticAssertion *)0x0) {
          operator_delete__((void *)local_248._0_8_);
        }
        local_248._0_8_ = local_248 + 0x18;
        local_248._16_8_ = (ResolutionPass *)0x8;
      }
      if (bVar11) {
        pCVar4 = (call->super_CallOrCastBase).arguments.object;
        if (pCVar4 == (CommaSeparatedList *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        pAVar3 = (Allocator *)(pCVar4->items).items;
        args.e = in_R8;
        args.s = (pool_ref<soul::AST::Expression> *)
                 (&(pAVar3->pool).pools.
                   super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (pCVar4->items).numActive);
        unaff_R13 = ASTUtilities::createStaticAssertion
                              ((ASTUtilities *)
                               &(call->super_CallOrCastBase).super_Expression.super_Statement.
                                super_ASTObject.context,
                               (Context *)(this->super_ErrorIgnoringRewritingASTVisitor).allocator,
                               pAVar3,args);
      }
      else {
        IdentifierPath::operator+
                  ((IdentifierPath *)local_248,this_00,
                   &((name->pathSections).
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     ._M_impl.super__Vector_impl_data._M_start)->path);
        bVar11 = IdentifierPath::isUnqualifiedName((IdentifierPath *)local_248,"at");
        local_248._8_8_ = 0;
        if ((ResolutionPass *)0x8 < (ulong)local_248._16_8_) {
          if ((StaticAssertion *)local_248._0_8_ != (StaticAssertion *)0x0) {
            operator_delete__((void *)local_248._0_8_);
          }
          local_248._0_8_ = local_248 + 0x18;
          local_248._16_8_ = (ResolutionPass *)0x8;
        }
        if (!bVar11) {
          pPVar5 = (name->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((long)(name->pathSections).
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5 != 0x60) ||
             ((pPVar5->specialisationArgs).object != (Expression *)0x0)) {
            psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
            *psVar1 = *psVar1 + 1;
LAB_0021b35d:
            bVar11 = false;
            unaff_R13 = (StaticAssertion *)call;
            goto LAB_0021b320;
          }
          pCVar4 = (call->super_CallOrCastBase).arguments.object;
          pSVar20 = unaff_R13;
          if (pCVar4 != (CommaSeparatedList *)0x0) {
            sVar6 = (pCVar4->items).numActive;
            bVar11 = sVar6 == 0;
            if (!bVar11) {
              ppVar7 = (pCVar4->items).items;
              lVar19 = 0;
              do {
                plVar8 = *(long **)((long)&ppVar7->object + lVar19);
                if ((int)plVar8[5] == 0) {
                  cVar12 = (**(code **)(*plVar8 + 0x18))();
                  bVar22 = true;
                  if (cVar12 == '\0') goto LAB_0021b3b1;
                }
                else {
LAB_0021b3b1:
                  if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == true) {
                    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
                    *psVar1 = *psVar1 + 1;
                    bVar22 = false;
                  }
                  else {
                    SanityCheckPass::throwErrorIfNotReadableValue
                              (*(Expression **)((long)&ppVar7->object + lVar19));
                    bVar22 = true;
                  }
                }
                if (!bVar22) break;
                lVar19 = lVar19 + 8;
                bVar11 = sVar6 << 3 == lVar19;
              } while (!bVar11);
            }
            pSVar20 = (StaticAssertion *)call;
            if (!bVar11) goto LAB_0021b35d;
          }
          findAllPossibleFunctions(&local_170,this,call,name);
          sVar6 = local_170.numActive;
          bVar11 = local_170.numActive == 0;
          unaff_R13 = pSVar20;
          if ((!bVar11) &&
             (unaff_R13 = (StaticAssertion *)call,
             *(byte *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                              super_Statement.super_ASTObject.objectType + 3) == 0)) {
            lVar19 = 0;
            do {
              bVar11 = local_170.numActive * 0x10 + -0x10 == lVar19;
              unaff_R13 = pSVar20;
              if (bVar11) break;
              cVar12 = *(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->
                                        super_Expression).super_Statement.super_ASTObject.context.
                                        location.location.data + lVar19 + 3);
              if (cVar12 != '\0') {
                pSVar20 = (StaticAssertion *)call;
              }
              lVar19 = lVar19 + 0x10;
              unaff_R13 = pSVar20;
            } while (cVar12 != '\x01');
          }
          if (bVar11) {
            bVar11 = SUB81(call,0);
            if ((local_170.numActive == 1) &&
               ((char)(((CallOrCastBase *)&(local_170.items)->function)->super_Expression).
                      super_Statement.super_ASTObject.objectType == Graph)) {
              resolveFunction((FunctionResolver *)local_248,(PossibleFunction *)this,
                              (CallOrCast *)local_170.items,bVar11);
              unaff_R13 = (StaticAssertion *)local_248._0_8_;
              if ((StaticAssertion *)local_248._0_8_ == (StaticAssertion *)0x0) {
                unaff_R13 = (StaticAssertion *)call;
              }
              goto LAB_0021b6b2;
            }
            if (local_170.numActive == 0) {
              local_2e8 = 0;
            }
            else {
              lVar19 = 0;
              local_2e8 = 0;
              do {
                if ((*(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->
                                      super_Expression).super_Statement.super_ASTObject.objectType +
                              lVar19) == '\0') &&
                   (*(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->
                                     super_Expression).super_Statement.super_ASTObject.objectType +
                             lVar19 + 1) == '\0')) {
                  uVar18 = (ulong)*(byte *)((long)&(((CallOrCastBase *)&(local_170.items)->function)
                                                   ->super_Expression).super_Statement.
                                                   super_ASTObject.objectType + lVar19 + 2) ^ 1;
                }
                else {
                  uVar18 = 0;
                }
                local_2e8 = local_2e8 + uVar18;
                lVar19 = lVar19 + 0x10;
              } while (local_170.numActive << 4 != lVar19);
            }
            if (local_2e8 == 1) {
              bVar22 = local_170.numActive == 0;
              if (!bVar22) {
                lVar19 = local_170.numActive << 4;
                pCVar17 = (CallOrCast *)local_170.items;
                do {
                  if (((char)(pCVar17->super_CallOrCastBase).super_Expression.super_Statement.
                             super_ASTObject.objectType == Graph) &&
                     (*(byte *)((long)&(pCVar17->super_CallOrCastBase).super_Expression.
                                       super_Statement.super_ASTObject.objectType + 1) == 0)) {
                    bVar21 = *(byte *)((long)&(pCVar17->super_CallOrCastBase).super_Expression.
                                              super_Statement.super_ASTObject.objectType + 2) ^ 1;
                  }
                  else {
                    bVar21 = 0;
                  }
                  if ((bVar21 != 0) &&
                     (resolveFunction((FunctionResolver *)local_248,(PossibleFunction *)this,pCVar17
                                      ,bVar11), unaff_R13 = (StaticAssertion *)local_248._0_8_,
                     (StaticAssertion *)local_248._0_8_ == (StaticAssertion *)0x0)) {
                    unaff_R13 = (StaticAssertion *)call;
                  }
                  if (bVar21 != 0) break;
                  pCVar17 = (CallOrCast *)
                            &(pCVar17->super_CallOrCastBase).super_Expression.super_Statement.
                             super_ASTObject.context;
                  lVar19 = lVar19 + -0x10;
                  bVar22 = lVar19 == 0;
                } while (!bVar22);
              }
              if (bVar22) {
                throwInternalCompilerError("visit",0x900);
              }
              goto LAB_0021b6b2;
            }
            local_280.items = (pool_ref<soul::AST::Expression> *)local_280.space;
            local_280.numActive = 0;
            local_280.numAllocated = 4;
            bVar22 = local_170.numActive == 0;
            if (!bVar22) {
              lVar19 = local_170.numActive << 4;
              pCVar17 = (CallOrCast *)local_170.items;
              do {
                bVar10 = true;
                if (((char)(pCVar17->super_CallOrCastBase).super_Expression.super_Statement.
                           super_ASTObject.objectType == Graph) &&
                   (*(byte *)((long)&(pCVar17->super_CallOrCastBase).super_Expression.
                                     super_Statement.super_ASTObject.objectType + 2) == 1)) {
                  resolveFunction((FunctionResolver *)local_248,(PossibleFunction *)this,pCVar17,
                                  bVar11);
                  uVar9 = local_248._0_8_;
                  if ((StaticAssertion *)local_248._0_8_ == (StaticAssertion *)0x0) {
                    iVar13 = (*(this->super_ErrorIgnoringRewritingASTVisitor).
                               super_RewritingASTVisitor._vptr_RewritingASTVisitor[0x38])();
                    if ((char)iVar13 == '\0') {
                      bVar10 = false;
                      unaff_R13 = (StaticAssertion *)call;
                      goto LAB_0021b60b;
                    }
                  }
                  else {
                    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
                              (&local_280,local_280.numActive + 1);
                    local_280.items[local_280.numActive] = (pool_ref<soul::AST::Expression>)uVar9;
                    local_280.numActive = local_280.numActive + 1;
                  }
                  bVar10 = true;
                }
LAB_0021b60b:
                if (!bVar10) break;
                pCVar17 = (CallOrCast *)
                          &(pCVar17->super_CallOrCastBase).super_Expression.super_Statement.
                           super_ASTObject.context;
                lVar19 = lVar19 + -0x10;
                bVar22 = lVar19 == 0;
              } while (!bVar22);
            }
            if (bVar22) {
              if (local_280.numActive == 1) {
                unaff_R13 = *(StaticAssertion **)local_280.items;
                goto LAB_0021b64e;
              }
              bVar11 = true;
              if ((local_280.numActive != 0) ||
                 ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false)) {
                if (sVar6 == 0) {
                  throwErrorForUnknownFunction(this,call,name);
                }
                if (local_170.numActive == 0) {
                  ppVar16 = (pool_ref<soul::AST::Function> *)0x0;
                }
                else {
                  lVar19 = 0;
                  ppVar16 = (pool_ref<soul::AST::Function> *)0x0;
                  do {
                    in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((ulong)*(byte *)((long)&(((CallOrCastBase *)
                                                      &(local_170.items)->function)->
                                                     super_Expression).super_Statement.
                                                     super_ASTObject.objectType + lVar19) ^ 1);
                    if (*(char *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->
                                         super_Expression).super_Statement.super_ASTObject.
                                         objectType + lVar19 + 1) == '\0') {
                      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                    }
                    ppVar16 = (pool_ref<soul::AST::Function> *)
                              ((long)&ppVar16->object + (long)in_R9);
                    lVar19 = lVar19 + 0x10;
                  } while (local_170.numActive << 4 != lVar19);
                }
                if ((long)&ppVar16->object + local_2e8 == 0) {
                  if (sVar6 == 1) {
                    if (local_170.numActive == 0) {
                      throwInternalCompilerError("! empty()","front",0xa7);
                    }
                    if (*(byte *)((long)&(((CallOrCastBase *)&(local_170.items)->function)->
                                         super_Expression).super_Statement.super_ASTObject.
                                         objectType + 2) == 0) {
                      AST::Function::getParameterTypes
                                ((TypeArray *)local_248,
                                 (Function *)
                                 (((CallOrCastBase *)&(local_170.items)->function)->super_Expression
                                 ).super_Statement.super_ASTObject._vptr_ASTObject);
                      pCVar4 = (call->super_CallOrCastBase).arguments.object;
                      if (pCVar4 == (CommaSeparatedList *)0x0) {
                        sVar15 = 0;
                      }
                      else {
                        sVar15 = (pCVar4->items).numActive;
                      }
                      if (local_248._8_8_ != sVar15) {
                        throwInternalCompilerError
                                  ("paramTypes.size() == call.getNumArguments()","visit",0x920);
                      }
                      if (local_248._8_8_ != 0) {
                        lVar19 = 0;
                        local_2c0 = "operator->";
                        local_2d8 = "object != nullptr";
                        uVar18 = 0;
                        do {
                          pCVar4 = (call->super_CallOrCastBase).arguments.object;
                          if (pCVar4 == (CommaSeparatedList *)0x0) {
                            iVar13 = 0x3c;
LAB_0021ba49:
                            throwInternalCompilerError(local_2d8,local_2c0,iVar13);
                          }
                          if ((pCVar4->items).numActive <= uVar18) {
                            iVar13 = 0x9e;
                            local_2d8 = "index < numActive";
                            local_2c0 = "operator[]";
                            goto LAB_0021ba49;
                          }
                          pEVar2 = (Expression *)local_248._0_8_;
                          (*(((pCVar4->items).items[uVar18].object)->super_Statement).
                            super_ASTObject._vptr_ASTObject[4])(local_2b8);
                          bVar22 = TypeRules::canPassAsArgumentTo
                                             ((Type *)((long)&(pEVar2->super_Statement).
                                                              super_ASTObject._vptr_ASTObject +
                                                      lVar19),(Type *)local_2b8,true);
                          RefCountedPtr<soul::Structure>::decIfNotNull
                                    ((Structure *)local_2b8._16_8_);
                          if (!bVar22) {
                            pCVar4 = (call->super_CallOrCastBase).arguments.object;
                            if (pCVar4 == (CommaSeparatedList *)0x0) {
                              iVar13 = 0x3c;
LAB_0021ba77:
                              throwInternalCompilerError(local_2d8,local_2c0,iVar13);
                            }
                            iVar13 = 0x9e;
                            if (((pCVar4->items).numActive <= uVar18) ||
                               ((ulong)local_248._8_8_ <= uVar18)) {
                              local_2d8 = "index < numActive";
                              local_2c0 = "operator[]";
                              goto LAB_0021ba77;
                            }
                            pEVar2 = (pCVar4->items).items[uVar18].object;
                            SanityCheckPass::expectSilentCastPossible
                                      (&(pEVar2->super_Statement).super_ASTObject.context,
                                       (Type *)((long)&(((Expression *)local_248._0_8_)->
                                                       super_Statement).super_ASTObject.
                                                       _vptr_ASTObject + lVar19),pEVar2);
                          }
                          uVar18 = uVar18 + 1;
                          lVar19 = lVar19 + 0x18;
                        } while (uVar18 < (ulong)local_248._8_8_);
                      }
                      ArrayWithPreallocation<soul::Type,_8UL>::clear
                                ((ArrayWithPreallocation<soul::Type,_8UL> *)local_248);
                      ppVar16 = extraout_RDX;
                    }
                  }
                  if ((sVar6 == 0) || (local_280.numActive < 2)) {
                    IdentifierPath::operator+
                              ((IdentifierPath *)local_248,this_00,
                               &((name->pathSections).
                                 super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->path);
                    IdentifierPath::toString_abi_cxx11_(&local_d8,(IdentifierPath *)local_248);
                    AST::CallOrCastBase::getDescription
                              ((string *)local_2b8,&call->super_CallOrCastBase,&local_d8);
                    CompileMessageHelpers::createMessage<std::__cxx11::string>
                              (&local_68,(CompileMessageHelpers *)0x1,none,0x2acd87,local_2b8,in_R9)
                    ;
                    AST::Context::throwError
                              (&(call->super_CallOrCastBase).super_Expression.super_Statement.
                                super_ASTObject.context,&local_68,false);
                  }
                }
                if ((1 < sVar6) || (1 < local_280.numActive)) {
                  local_2b8._0_8_ = local_2a0;
                  local_2b8._8_8_ = 0;
                  local_2b8._16_8_ = (Structure *)0x4;
                  if (local_170.numActive != 0) {
                    lVar19 = 0;
                    do {
                      uVar9 = *(undefined8 *)
                               ((long)&(((CallOrCastBase *)&(local_170.items)->function)->
                                       super_Expression).super_Statement.super_ASTObject.
                                       _vptr_ASTObject + lVar19);
                      ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL>::reserve
                                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Function>,_4UL> *
                                 )local_2b8,local_2b8._8_8_ + 1);
                      *(undefined8 *)(local_2b8._0_8_ + local_2b8._8_8_ * 8) = uVar9;
                      local_2b8._8_8_ = local_2b8._8_8_ + 1;
                      lVar19 = lVar19 + 0x10;
                      ppVar16 = extraout_RDX_00;
                    } while (local_170.numActive << 4 != lVar19);
                  }
                  functions_00.e = ppVar16;
                  functions_00.s =
                       (pool_ref<soul::AST::Function> *)(local_2b8._0_8_ + local_2b8._8_8_ * 8);
                  SanityCheckPass::checkForDuplicateFunctions
                            ((SanityCheckPass *)local_2b8._0_8_,functions_00);
                  IdentifierPath::operator+
                            ((IdentifierPath *)local_248,this_00,
                             &((name->pathSections).
                               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                               ._M_impl.super__Vector_impl_data._M_start)->path);
                  IdentifierPath::toString_abi_cxx11_(&local_118,(IdentifierPath *)local_248);
                  AST::CallOrCastBase::getDescription
                            (&local_f8,&call->super_CallOrCastBase,&local_118);
                  CompileMessageHelpers::createMessage<std::__cxx11::string>
                            (&local_a0,(CompileMessageHelpers *)0x1,none,0x2ace1d,(char *)&local_f8,
                             in_R9);
                  AST::Context::throwError
                            (&(call->super_CallOrCastBase).super_Expression.super_Statement.
                              super_ASTObject.context,&local_a0,false);
                }
              }
            }
            else {
LAB_0021b64e:
              bVar11 = false;
            }
            local_280.numActive = 0;
            if (4 < local_280.numAllocated) {
              if (local_280.items != (pool_ref<soul::AST::Expression> *)0x0) {
                operator_delete__(local_280.items);
              }
              local_280.items = (pool_ref<soul::AST::Expression> *)local_280.space;
              local_280.numAllocated = 4;
            }
          }
          else {
LAB_0021b6b2:
            bVar11 = false;
          }
          local_170.numActive = 0;
          if ((4 < local_170.numAllocated) && ((CallOrCast *)local_170.items != (CallOrCast *)0x0))
          {
            operator_delete__(local_170.items);
          }
          goto LAB_0021b320;
        }
        unaff_R13 = (StaticAssertion *)createAtCall(this,call);
      }
    }
    bVar11 = false;
  }
LAB_0021b320:
  if (!bVar11) {
    return &unaff_R13->super_Expression;
  }
LAB_0021b325:
  psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
  *psVar1 = *psVar1 + 1;
  return (Expression *)call;
}

Assistant:

AST::Expression& visit (AST::CallOrCast& call) override
        {
            super::visit (call);

            if (AST::isResolvedAsType (call.nameOrType.get()))
                return convertToCast (allocator, call, call.nameOrType->resolveAsType());

            if (call.areAllArgumentsResolved())
            {
                if (auto name = cast<AST::QualifiedIdentifier> (call.nameOrType))
                {
                    if (name->getPath().isUnqualifiedName ("advance"))
                        return createAdvanceCall (call);

                    if (name->getPath().isUnqualifiedName ("static_assert"))
                        return ASTUtilities::createStaticAssertion (call.context, allocator, call.arguments->items);

                    if (name->getPath().isUnqualifiedName ("at"))
                        return createAtCall (call);

                    if (! name->isSimplePath())
                    {
                        numFails++;
                        return call;
                    }

                    if (call.arguments != nullptr)
                    {
                        for (auto& arg : call.arguments->items)
                        {
                            if (! AST::isResolvedAsValue (arg.get()))
                            {
                                if (ignoreErrors)
                                {
                                    ++numFails;
                                    return call;
                                }

                                SanityCheckPass::throwErrorIfNotReadableValue (arg);
                            }
                        }
                    }

                    auto possibles = findAllPossibleFunctions (call, *name);

                    for (auto& f : possibles)
                        if (f.functionIsNotResolved)
                            return call;

                    auto totalMatches = possibles.size();

                    // If there's only one function found, and we can call it (maybe with a cast), then go for it..
                    if (totalMatches == 1 && ! possibles.front().isImpossible)
                    {
                        if (auto resolved = resolveFunction (possibles.front(), call, ignoreErrors))
                            return *resolved;

                        return call;
                    }

                    auto exactMatches = countNumberOfExactMatches (possibles);

                    // If there's one exact match, then even if there are others requiring casts, we'll ignore them
                    // and go for the one which is a perfect match..
                    if (exactMatches == 1)
                    {
                        for (auto& f : possibles)
                        {
                            if (f.isExactMatch())
                            {
                                if (auto resolved = resolveFunction (f, call, ignoreErrors))
                                    return *resolved;

                                return call;
                            }
                        }

                        SOUL_ASSERT_FALSE;
                    }

                    // If there are any generic functions, see if exactly one of these works
                    ArrayWithPreallocation<pool_ref<AST::Expression>, 4> matchingGenerics;

                    for (auto& f : possibles)
                    {
                        if (! f.isImpossible && f.requiresGeneric)
                        {
                            if (auto e = resolveFunction (f, call, true))
                                matchingGenerics.push_back (*e);
                            else if (! canResolveGenerics())
                                return call;
                        }
                    }

                    if (matchingGenerics.size() == 1)
                        return matchingGenerics.front();

                    if (! ignoreErrors || matchingGenerics.size() > 1)
                    {
                        if (totalMatches == 0)
                            throwErrorForUnknownFunction (call, *name);

                        auto possibleWithCast = countNumberOfMatchesWithCast (possibles);

                        if (exactMatches + possibleWithCast == 0)
                        {
                            if (totalMatches == 1 && ! possibles.front().requiresGeneric)
                            {
                                auto paramTypes = possibles.front().function.getParameterTypes();
                                SOUL_ASSERT (paramTypes.size() == call.getNumArguments());

                                for (size_t i = 0; i < paramTypes.size(); ++i)
                                    if (! TypeRules::canPassAsArgumentTo (paramTypes[i], call.arguments->items[i]->getResultType(), true))
                                        SanityCheckPass::expectSilentCastPossible (call.arguments->items[i]->context,
                                                                                   paramTypes[i], call.arguments->items[i]);
                            }

                            if (totalMatches == 0 || matchingGenerics.size() <= 1)
                                call.context.throwError (Errors::noMatchForFunctionCall (call.getDescription (name->getPath().toString())));
                        }

                        if (totalMatches > 1 || matchingGenerics.size() > 1)
                        {
                            ArrayWithPreallocation<pool_ref<AST::Function>, 4> functions;

                            for (auto& f : possibles)
                                functions.push_back (f.function);

                            SanityCheckPass::checkForDuplicateFunctions (functions);

                            call.context.throwError (Errors::ambiguousFunctionCall (call.getDescription (name->getPath().toString())));
                        }
                    }
                }
            }

            ++numFails;
            return call;
        }